

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_file_utilities.cpp
# Opt level: O1

bool CleanAndRemoveFileName
               (wchar_t *dirty_path,bool bPathIncludesFileName,ON_wString *volume,
               ON_wString *clean_path,ON_wString *file_name)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  wchar_t *pwVar4;
  wchar_t **fname;
  ulong string_length;
  ON_wString path;
  wchar_t *f;
  wchar_t *d;
  wchar_t *v;
  
  ON_FileSystemPath::CleanPath((ON_FileSystemPath *)&path,true,true,true,true,false,L'/',dirty_path)
  ;
  bVar1 = ON_wString::IsEmpty(&path);
  if (!bVar1) {
    if (!bPathIncludesFileName) {
      iVar2 = ON_wString::Length(&path);
      pwVar4 = ON_wString::operator[](&path,iVar2 + -1);
      if ((*pwVar4 != L'/') && (*pwVar4 != L'\\')) {
        ON_wString::operator+=(&path,L'/');
      }
    }
    pwVar4 = ON_wString::operator_cast_to_wchar_t_(&path);
    v = (wchar_t *)0x0;
    d = (wchar_t *)0x0;
    f = (wchar_t *)0x0;
    fname = &f;
    if (!bPathIncludesFileName) {
      fname = (wchar_t **)0x0;
    }
    on_wsplitpath(pwVar4,&v,&d,fname,(wchar_t **)0x0);
    iVar2 = 2;
    if ((d != (wchar_t *)0x0) && (*d != L'\0')) {
      ON_wString::operator=(clean_path,d);
      if (bPathIncludesFileName) {
        if ((f == (wchar_t *)0x0) || (*f == L'\0')) goto LAB_004734a7;
        iVar3 = ON_wString::Length(&path);
        iVar2 = 2;
        if ((((iVar3 == 0) || ((d < pwVar4 || (pwVar4 + iVar3 <= f || f <= d)))) ||
            ((f[-1] != L'\\' && (f[-1] != L'/')))) ||
           (string_length = (long)f - (long)d >> 2, string_length < 2)) {
LAB_0047349b:
          bVar1 = false;
        }
        else {
          iVar3 = ON_wString::Length(clean_path);
          if ((ulong)(long)iVar3 <= string_length) goto LAB_0047349b;
          if (file_name != (ON_wString *)0x0) {
            ON_wString::operator=(file_name,f);
          }
          ON_wString::SetLength(clean_path,string_length);
          iVar2 = 0;
          bVar1 = true;
        }
        if (!bVar1) goto LAB_004734a7;
      }
      else if (file_name != (ON_wString *)0x0) {
        ON_wString::operator=(file_name,&ON_wString::EmptyString);
      }
      iVar2 = 1;
    }
LAB_004734a7:
    bVar1 = true;
    if (iVar2 != 2) goto LAB_004734e4;
  }
  ON_wString::operator=(volume,&ON_wString::EmptyString);
  ON_wString::operator=(clean_path,&ON_wString::EmptyString);
  if (file_name != (ON_wString *)0x0) {
    ON_wString::operator=(file_name,&ON_wString::EmptyString);
  }
  bVar1 = false;
LAB_004734e4:
  ON_wString::~ON_wString(&path);
  return bVar1;
}

Assistant:

static bool CleanAndRemoveFileName(
  const wchar_t* dirty_path,
  bool bPathIncludesFileName,
  ON_wString& volume,
  ON_wString& clean_path,
  ON_wString* file_name
  )
{
  ON_wString path = ON_FileSystemPath::CleanPath(dirty_path);
  for (;;)
  {
    if (path.IsEmpty())
      break;

    if (false == bPathIncludesFileName && false == IsDirSep(path[path.Length() - 1]))
      path += ON_FileSystemPath::DirectorySeparator;

    const wchar_t* p = static_cast<const wchar_t*>(path);
    const wchar_t* v = nullptr;
    const wchar_t* d = nullptr;
    const wchar_t* f = nullptr;
    on_wsplitpath(p, &v, &d, bPathIncludesFileName ? &f : nullptr, nullptr);

    if (nullptr == d || 0 == d[0])
      break;
    
    clean_path = d;

    if (bPathIncludesFileName)
    {
      // remove trailing file name from base_path.
      if (nullptr == f || 0 == f[0])
        break;
      const size_t path_length = (size_t)path.Length();
      if  ( path_length <= 0 )
        break;
      if (!(p <= d && d < f && f < p + path_length))
        break;
      if (!IsDirSep(f[-1]))
        break;
      size_t len = (f - d);
      if (len <= 1 || len >= (size_t)clean_path.Length())
        break;
      if ( nullptr != file_name )
        *file_name = f;
      clean_path.SetLength(len);
    }
    else
    {
      if ( nullptr != file_name )
        *file_name = ON_wString::EmptyString;
    }

    return true;
  }

  volume = ON_wString::EmptyString;
  clean_path = ON_wString::EmptyString;
  if ( nullptr != file_name )
    *file_name = ON_wString::EmptyString;
  return false;
}